

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_options.cpp
# Opt level: O3

string * __thiscall
RandomizerOptions::permalink_abi_cxx11_(string *__return_storage_ptr__,RandomizerOptions *this)

{
  byte bVar1;
  value_t vVar2;
  ushort uVar3;
  object_t *poVar4;
  pointer pcVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long lVar9;
  size_t i;
  bool bVar10;
  BitstreamWriter bitpack;
  BitstreamWriter local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._bit_position = '\b';
  BitstreamWriter::add_variable_length_number(&local_88,0x12);
  BitstreamWriter::add_variable_length_number(&local_88,(uint)this->_goal);
  BitstreamWriter::add_variable_length_number(&local_88,(uint)this->_jewel_count);
  BitstreamWriter::add_variable_length_number(&local_88,(uint)this->_starting_life);
  BitstreamWriter::add_variable_length_number(&local_88,(uint)this->_starting_gold);
  BitstreamWriter::add_variable_length_number(&local_88,(uint)this->_health_gained_per_lifestock);
  BitstreamWriter::add_bit(&local_88,this->_fast_transitions);
  local_68._M_dataplus._M_p._0_4_ = this->_seed;
  BitstreamWriter::pack_pod_type<unsigned_int>(&local_88,(uint *)&local_68);
  BitstreamWriter::add_bit(&local_88,this->_use_armor_upgrades);
  BitstreamWriter::add_bit(&local_88,this->_fix_armlet_skip);
  BitstreamWriter::add_bit(&local_88,this->_remove_tree_cutting_glitch_drops);
  BitstreamWriter::add_bit(&local_88,this->_consumable_record_book);
  BitstreamWriter::add_bit(&local_88,this->_consumable_spell_book);
  BitstreamWriter::add_bit(&local_88,this->_remove_gumi_boulder);
  BitstreamWriter::add_bit(&local_88,this->_remove_tibor_requirement);
  BitstreamWriter::add_bit(&local_88,this->_all_trees_visited_at_start);
  BitstreamWriter::add_bit(&local_88,this->_ekeeke_auto_revive);
  BitstreamWriter::add_bit(&local_88,this->_allow_spoiler_log);
  BitstreamWriter::add_bit(&local_88,this->_shuffle_tibor_trees);
  BitstreamWriter::add_bit(&local_88,this->_enemy_jumping_in_logic);
  BitstreamWriter::add_bit(&local_88,this->_tree_cutting_glitch_in_logic);
  BitstreamWriter::add_bit(&local_88,this->_damage_boosting_in_logic);
  BitstreamWriter::add_bit(&local_88,this->_allow_whistle_usage_behind_trees);
  BitstreamWriter::add_bit(&local_88,this->_ensure_ekeeke_in_shops);
  lVar9 = -0x45;
  do {
    BitstreamWriter::add_variable_length_number
              (&local_88,(uint)*(uint8_t *)((long)(&this->_items_distribution + 1) + lVar9));
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0);
  BitstreamWriter::add_variable_length_number(&local_88,(uint)this->_filler_item);
  BitstreamWriter::add_variable_length_number
            (&local_88,(uint)this->_hints_distribution_region_requirement);
  BitstreamWriter::add_variable_length_number
            (&local_88,(uint)this->_hints_distribution_item_requirement);
  BitstreamWriter::add_variable_length_number
            (&local_88,(uint)this->_hints_distribution_item_location);
  BitstreamWriter::add_variable_length_number(&local_88,(uint)this->_hints_distribution_dark_region)
  ;
  BitstreamWriter::add_variable_length_number(&local_88,(uint)this->_hints_distribution_joke);
  BitstreamWriter::add_bit(&local_88,this->_christmas_event);
  BitstreamWriter::add_bit(&local_88,this->_secret_event);
  uVar3 = this->_enemies_damage_factor;
  BitstreamWriter::add_bit(&local_88,uVar3 != 100);
  if (uVar3 != 100) {
    BitstreamWriter::add_variable_length_number(&local_88,(uint)uVar3);
  }
  uVar3 = this->_enemies_health_factor;
  BitstreamWriter::add_bit(&local_88,uVar3 != 100);
  if (uVar3 != 100) {
    BitstreamWriter::add_variable_length_number(&local_88,(uint)uVar3);
  }
  uVar3 = this->_enemies_armor_factor;
  BitstreamWriter::add_bit(&local_88,uVar3 != 100);
  if (uVar3 != 100) {
    BitstreamWriter::add_variable_length_number(&local_88,(uint)uVar3);
  }
  uVar3 = this->_enemies_golds_factor;
  BitstreamWriter::add_bit(&local_88,uVar3 != 100);
  if (uVar3 != 100) {
    BitstreamWriter::add_variable_length_number(&local_88,(uint)uVar3);
  }
  uVar3 = this->_enemies_drop_chance_factor;
  BitstreamWriter::add_bit(&local_88,uVar3 != 100);
  if (uVar3 != 100) {
    BitstreamWriter::add_variable_length_number(&local_88,(uint)uVar3);
  }
  uVar3 = this->_shop_prices_factor;
  BitstreamWriter::add_bit(&local_88,uVar3 != 100);
  if (uVar3 != 100) {
    BitstreamWriter::add_variable_length_number(&local_88,(uint)uVar3);
  }
  lVar9 = 0;
  do {
    bVar1 = (this->_starting_items)._M_elems[lVar9];
    if (bVar1 != 0) {
      BitstreamWriter::add_bit(&local_88,true);
      BitstreamWriter::add_variable_length_number(&local_88,(uint32_t)lVar9);
      BitstreamWriter::add_variable_length_number(&local_88,(uint)bVar1);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x3e);
  BitstreamWriter::add_bit(&local_88,false);
  BitstreamWriter::pack_vector<unsigned_char>(&local_88,&this->_possible_spawn_locations);
  BitstreamWriter::pack_vector<unsigned_char>(&local_88,&this->_finite_ground_items);
  BitstreamWriter::pack_vector<unsigned_char>(&local_88,&this->_finite_shop_items);
  vVar2 = (this->_world_json).m_type;
  if (vVar2 == null) {
    bVar10 = true;
  }
  else if ((vVar2 == object) || (vVar2 == array)) {
    poVar4 = (this->_world_json).m_value.object;
    bVar10 = (poVar4->
             super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ).
             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (poVar4->
             super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ).
             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar10 = false;
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,&this->_world_json
              );
  BitstreamWriter::add_bit(&local_88,(bool)(bVar10 ^ 1));
  if (bVar10 == false) {
    BitstreamWriter::pack_vector<unsigned_char>
              (&local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  }
  if (local_68._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_68._M_dataplus._M_p,
                    local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
  }
  vVar2 = (this->_model_patch_items).m_type;
  if (vVar2 == null) {
    bVar10 = true;
  }
  else if ((vVar2 == object) || (vVar2 == array)) {
    poVar4 = (this->_model_patch_items).m_value.object;
    bVar10 = (poVar4->
             super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ).
             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (poVar4->
             super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ).
             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar10 = false;
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
               &this->_model_patch_items);
  BitstreamWriter::add_bit(&local_88,(bool)(bVar10 ^ 1));
  if (bVar10 == false) {
    BitstreamWriter::pack_vector<unsigned_char>
              (&local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  }
  if (local_68._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_68._M_dataplus._M_p,
                    local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
  }
  vVar2 = (this->_model_patch_spawns).m_type;
  if (vVar2 == null) {
    bVar10 = true;
  }
  else if ((vVar2 == object) || (vVar2 == array)) {
    poVar4 = (this->_model_patch_spawns).m_value.object;
    bVar10 = (poVar4->
             super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ).
             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (poVar4->
             super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ).
             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar10 = false;
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
               &this->_model_patch_spawns);
  BitstreamWriter::add_bit(&local_88,(bool)(bVar10 ^ 1));
  if (bVar10 == false) {
    BitstreamWriter::pack_vector<unsigned_char>
              (&local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  }
  if (local_68._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_68._M_dataplus._M_p,
                    local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
  }
  vVar2 = (this->_model_patch_hint_sources).m_type;
  if (vVar2 == null) {
    bVar10 = true;
  }
  else if ((vVar2 == object) || (vVar2 == array)) {
    poVar4 = (this->_model_patch_hint_sources).m_value.object;
    bVar10 = (poVar4->
             super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ).
             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (poVar4->
             super_vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ).
             super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar10 = false;
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::to_msgpack((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
               &this->_model_patch_hint_sources);
  BitstreamWriter::add_bit(&local_88,(bool)(bVar10 ^ 1));
  if (bVar10 == false) {
    BitstreamWriter::pack_vector<unsigned_char>
              (&local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  }
  if (local_68._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_68._M_dataplus._M_p,
                    local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
  }
  base64_encode_abi_cxx11_(&local_48,&local_88._bytes);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_48,0,0,"l",1);
  local_68._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar8) {
    local_68.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_68.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_68._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_68,"s");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar5 = (pbVar7->_M_dataplus)._M_p;
  paVar8 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar8) {
    uVar6 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_88._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RandomizerOptions::permalink() const
{
    BitstreamWriter bitpack;

    bitpack.pack((uint8_t)MAJOR_RELEASE);

    bitpack.pack(_goal);
    bitpack.pack(_jewel_count);
    bitpack.pack(_starting_life);
    bitpack.pack(_starting_gold);
    bitpack.pack(_health_gained_per_lifestock);
    bitpack.pack(_fast_transitions);

    bitpack.pack(_seed);

    bitpack.pack(_use_armor_upgrades);
    bitpack.pack(_fix_armlet_skip);
    bitpack.pack(_remove_tree_cutting_glitch_drops);
    bitpack.pack(_consumable_record_book);
    bitpack.pack(_consumable_spell_book);
    bitpack.pack(_remove_gumi_boulder);
    bitpack.pack(_remove_tibor_requirement);
    bitpack.pack(_all_trees_visited_at_start);
    bitpack.pack(_ekeeke_auto_revive);
    bitpack.pack(_allow_spoiler_log);
    bitpack.pack(_shuffle_tibor_trees);
    bitpack.pack(_enemy_jumping_in_logic);
    bitpack.pack(_tree_cutting_glitch_in_logic);
    bitpack.pack(_damage_boosting_in_logic);
    bitpack.pack(_allow_whistle_usage_behind_trees);
    bitpack.pack(_ensure_ekeeke_in_shops);
    bitpack.pack_array(_items_distribution);
    bitpack.pack(_filler_item);
    bitpack.pack(_hints_distribution_region_requirement);
    bitpack.pack(_hints_distribution_item_requirement);
    bitpack.pack(_hints_distribution_item_location);
    bitpack.pack(_hints_distribution_dark_region);
    bitpack.pack(_hints_distribution_joke);
    bitpack.pack(_christmas_event);
    bitpack.pack(_secret_event);

    bitpack.pack_if(_enemies_damage_factor != 100, _enemies_damage_factor);
    bitpack.pack_if(_enemies_health_factor != 100, _enemies_health_factor);
    bitpack.pack_if(_enemies_armor_factor != 100, _enemies_armor_factor);
    bitpack.pack_if(_enemies_golds_factor != 100, _enemies_golds_factor);
    bitpack.pack_if(_enemies_drop_chance_factor != 100, _enemies_drop_chance_factor);
    bitpack.pack_if(_shop_prices_factor != 100, _shop_prices_factor);

    for(size_t i=0 ; i<_starting_items.size() ; ++i)
    {
        uint8_t item_id = (uint8_t)i;
        uint8_t quantity = _starting_items[i];
        if(quantity != 0)
        {
            bitpack.pack(true);
            bitpack.pack(item_id);
            bitpack.pack(quantity);
        }
    }
    bitpack.pack(false);

    bitpack.pack_vector(_possible_spawn_locations);
    bitpack.pack_vector(_finite_ground_items);
    bitpack.pack_vector(_finite_shop_items);

    bitpack.pack_vector_if(!_world_json.empty(), Json::to_msgpack(_world_json));
    bitpack.pack_vector_if(!_model_patch_items.empty(), Json::to_msgpack(_model_patch_items));
    bitpack.pack_vector_if(!_model_patch_spawns.empty(), Json::to_msgpack(_model_patch_spawns));
    bitpack.pack_vector_if(!_model_patch_hint_sources.empty(), Json::to_msgpack(_model_patch_hint_sources));

    return "l" + base64_encode(bitpack.bytes()) + "s";
}